

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classarray.h
# Opt level: O1

ptrdiff_t __thiscall
soplex::
ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
::reMax(ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        *this,int newMax,int newSize)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ulong uVar7;
  int *piVar8;
  uint n;
  long lVar9;
  ptrdiff_t pVar10;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *newMem;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_28;
  
  if (newSize < 0) {
    newSize = this->thesize;
  }
  if (newMax <= newSize) {
    newMax = newSize;
  }
  n = 1;
  if (1 < newMax) {
    n = newMax;
  }
  if (n == this->themax) {
    this->thesize = newSize;
    pVar10 = 0;
  }
  else {
    local_28 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x0;
    spx_alloc<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>*>
              (&local_28,n);
    uVar7 = 0;
    if ((0 < newSize) && (0 < this->thesize)) {
      lVar9 = 0x38;
      uVar7 = 0;
      do {
        pNVar3 = this->data;
        *(undefined8 *)((long)(local_28->val).m_backend.data._M_elems + lVar9 + -0x18) =
             *(undefined8 *)((long)(pNVar3->val).m_backend.data._M_elems + lVar9 + -0x18);
        puVar1 = (undefined8 *)((long)(&pNVar3->val + -1) + lVar9);
        uVar4 = *puVar1;
        uVar5 = puVar1[1];
        puVar1 = (undefined8 *)((long)(&(pNVar3->val).m_backend.data + -1) + lVar9);
        uVar6 = puVar1[1];
        puVar2 = (undefined8 *)((long)(&(local_28->val).m_backend.data + -1) + lVar9);
        *puVar2 = *puVar1;
        puVar2[1] = uVar6;
        puVar1 = (undefined8 *)((long)(&local_28->val + -1) + lVar9);
        *puVar1 = uVar4;
        puVar1[1] = uVar5;
        *(undefined4 *)((long)(local_28->val).m_backend.data._M_elems + lVar9 + -0x10) =
             *(undefined4 *)((long)(pNVar3->val).m_backend.data._M_elems + lVar9 + -0x10);
        *(undefined1 *)((long)(local_28->val).m_backend.data._M_elems + lVar9 + -0xc) =
             *(undefined1 *)((long)(pNVar3->val).m_backend.data._M_elems + lVar9 + -0xc);
        *(undefined8 *)((long)(local_28->val).m_backend.data._M_elems + lVar9 + -8) =
             *(undefined8 *)((long)(pNVar3->val).m_backend.data._M_elems + lVar9 + -8);
        *(undefined4 *)((long)(local_28->val).m_backend.data._M_elems + lVar9) =
             *(undefined4 *)((long)(pNVar3->val).m_backend.data._M_elems + lVar9);
        uVar7 = uVar7 + 1;
        if ((uint)newSize <= uVar7) break;
        lVar9 = lVar9 + 0x3c;
      } while ((long)uVar7 < (long)this->thesize);
    }
    if ((uint)uVar7 < n) {
      piVar8 = &local_28[uVar7 & 0xffffffff].idx;
      lVar9 = (ulong)n - (uVar7 & 0xffffffff);
      do {
        *(undefined8 *)(piVar8 + -2) = 0xa00000000;
        (((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)(piVar8 + -0xe))->val).m_backend.data._M_elems[0] = 0;
        (((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)(piVar8 + -0xe))->val).m_backend.data._M_elems[1] = 0;
        (piVar8 + -0xc)[0] = 0;
        (piVar8 + -0xc)[1] = 0;
        (piVar8 + -10)[0] = 0;
        (piVar8 + -10)[1] = 0;
        (piVar8 + -8)[0] = 0;
        (piVar8 + -8)[1] = 0;
        *(undefined8 *)((long)piVar8 + -0x1b) = 0;
        *(undefined8 *)((long)piVar8 + -0x13) = 0;
        *piVar8 = 0;
        piVar8 = piVar8 + 0xf;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
    }
    pVar10 = (long)local_28 - (long)this->data;
    free(this->data);
    this->data = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)0x0;
    this->data = local_28;
    this->themax = n;
    this->thesize = newSize;
  }
  return pVar10;
}

Assistant:

ptrdiff_t reMax(int newMax = 1, int newSize = -1)
   {
      /* process input */
      if(newSize < 0)
         newSize = size();

      if(newMax < 1)
         newMax = 1;

      if(newMax < newSize)
         newMax = newSize;

      /* nothing to reallocate */
      if(newMax == themax)
      {
         thesize = newSize;
         return 0;
      }

      /* allocate new memory */
      T* newMem = nullptr;
      spx_alloc(newMem, newMax);

      /* call copy constructor for first elements */
      int i;

      for(i = 0; i < size() && i < newSize; i++)
         new(&(newMem[i])) T(data[i]);

      /* call default constructor for remaining elements */
      for(; i < newMax; i++)
         new(&(newMem[i])) T();

      /* compute pointer difference */
      ptrdiff_t pshift = reinterpret_cast<char*>(newMem) - reinterpret_cast<char*>(data);

      /* free old memory */
      for(i = themax - 1; i >= 0; i--)
         data[i].~T();

      spx_free(data);

      /* assign new memory */
      data = newMem;
      themax = newMax;
      thesize = newSize;

      return pshift;
   }